

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void Eigen::internal::
     Assignment<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
     ::run(Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *dst,SrcXprType *src,
          assign_op<double,_double> *param_3)

{
  Index nrows;
  Index ncols;
  Index IVar1;
  LhsNestedCleaned *lhs;
  RhsNestedCleaned *rhs;
  Index dstCols;
  Index dstRows;
  assign_op<double,_double> *param_2_local;
  SrcXprType *src_local;
  Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *dst_local;
  
  nrows = Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
          ::rows(src);
  ncols = Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
          ::cols(src);
  IVar1 = Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows(dst);
  if (IVar1 == nrows) {
    IVar1 = Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cols(dst);
    if (IVar1 == ncols) goto LAB_001d9a9d;
  }
  Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(dst,nrows,ncols);
LAB_001d9a9d:
  lhs = Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
        ::lhs(src);
  rhs = Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
        ::rhs(src);
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,Eigen::Matrix<double,3,3,0,3,3>,Eigen::DenseShape,Eigen::DenseShape,3>
  ::evalTo<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>(dst,lhs,rhs);
  return;
}

Assistant:

void run(DstXprType &dst, const SrcXprType &src, const internal::assign_op<Scalar,Scalar> &)
  {
    Index dstRows = src.rows();
    Index dstCols = src.cols();
    if((dst.rows()!=dstRows) || (dst.cols()!=dstCols))
      dst.resize(dstRows, dstCols);
    // FIXME shall we handle nested_eval here?
    generic_product_impl<Lhs, Rhs>::evalTo(dst, src.lhs(), src.rhs());
  }